

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_71(QPDF *pdf,char *arg2)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar6;
  value_type page;
  QPDFPageObjectHelper fx1;
  long *local_2d8;
  long local_2d0;
  long local_2c8 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_2b8;
  undefined1 local_288 [32];
  long local_268;
  element_type *local_260;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_258;
  undefined8 local_250;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_248;
  string local_240 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  string local_230 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  string local_220 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218;
  long *local_210 [2];
  long local_200 [2];
  QPDFPageObjectHelper local_1f0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  code *local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  code *local_188;
  code *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  code *local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  code *local_148;
  code *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  code *local_128;
  code *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  code *local_108;
  code *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  code *local_88;
  code *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_1f0,pdf);
  QPDFPageDocumentHelper::getAllPages();
  if (local_2b8._M_impl.super__Rb_tree_header._M_header._0_8_ != local_2b8._M_impl._0_8_) {
    local_288._8_8_ = *(undefined8 *)(local_2b8._M_impl._0_8_ + 8);
    local_288._16_8_ = *(long *)(local_2b8._M_impl._0_8_ + 0x10);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._16_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._16_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._16_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._16_8_)->_M_use_count + 1;
      }
    }
    local_288._24_8_ = *(undefined8 *)(local_2b8._M_impl._0_8_ + 0x18);
    local_268 = *(long *)(local_2b8._M_impl._0_8_ + 0x20);
    if (local_268 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_268 + 8) = *(int *)(local_268 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_268 + 8) = *(int *)(local_268 + 8) + 1;
      }
    }
    local_288._0_8_ = &PTR__QPDFPageObjectHelper_001599e0;
    local_260 = *(element_type **)(local_2b8._M_impl._0_8_ + 0x28);
    local_258._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_2b8._M_impl._0_8_ + 0x30);
    if (local_258._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_258._M_pi)->_M_use_count = (local_258._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_258._M_pi)->_M_use_count = (local_258._M_pi)->_M_use_count + 1;
      }
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_2b8);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- recursive, all ---",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    local_58 = 0;
    uStack_50 = 0;
    local_40 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
               ::_M_manager;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = (code *)0x0;
    uStack_60 = 0;
    QPDFPageObjectHelper::forEachXObject(local_288,1);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- non-recursive, all ---",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    local_98 = 0;
    uStack_90 = 0;
    local_80 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
               ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
               ::_M_manager;
    local_b8 = 0;
    uStack_b0 = 0;
    local_a8 = (code *)0x0;
    uStack_a0 = 0;
    QPDFPageObjectHelper::forEachXObject(local_288,0);
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,3);
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- recursive, images ---",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    local_d8 = 0;
    uStack_d0 = 0;
    local_c0 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
               ::_M_manager;
    QPDFPageObjectHelper::forEachImage(local_288,1);
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- non-recursive, images ---",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    local_f8 = 0;
    uStack_f0 = 0;
    local_e0 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
               ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
               ::_M_manager;
    QPDFPageObjectHelper::forEachImage(local_288,0);
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- recursive, form XObjects ---",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    local_118 = 0;
    uStack_110 = 0;
    local_100 = std::
                _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
                ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
                ::_M_manager;
    QPDFPageObjectHelper::forEachFormXObject(local_288,1);
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- non-recursive, form XObjects ---",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    local_138 = 0;
    uStack_130 = 0;
    local_120 = std::
                _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
                ::_M_invoke;
    local_128 = std::
                _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
                ::_M_manager;
    QPDFPageObjectHelper::forEachFormXObject(local_288,0);
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,3);
    }
    local_250 = local_288._8_8_;
    local_248 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._16_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_288._16_8_ + 8) = *(_Atomic_word *)(local_288._16_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_288._16_8_ + 8) = *(_Atomic_word *)(local_288._16_8_ + 8) + 1;
      }
    }
    pp_Var1 = &local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_2b8._M_impl._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"/Resources","");
    QPDFObjectHandle::getKey(local_240);
    local_2d8 = local_2c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"/XObject","");
    QPDFObjectHandle::getKey(local_230);
    local_210[0] = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"/Fx1","");
    QPDFObjectHandle::getKey(local_220);
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_220;
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_1f0,QVar6);
    if (local_218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218);
    }
    if (local_210[0] != local_200) {
      operator_delete(local_210[0],local_200[0] + 1);
    }
    if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
    }
    if (local_2d8 != local_2c8) {
      operator_delete(local_2d8,local_2c8[0] + 1);
    }
    if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238);
    }
    if ((_Base_ptr *)local_2b8._M_impl._0_8_ != pp_Var1) {
      operator_delete((void *)local_2b8._M_impl._0_8_,
                      (ulong)((long)&(local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    if (local_248 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- recursive, all, from fx1 ---",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    local_158 = 0;
    uStack_150 = 0;
    local_140 = std::
                _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
                ::_M_invoke;
    local_148 = std::
                _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
                ::_M_manager;
    local_178 = 0;
    uStack_170 = 0;
    local_168 = (code *)0x0;
    uStack_160 = 0;
    QPDFPageObjectHelper::forEachXObject(&local_1f0,1);
    if (local_168 != (code *)0x0) {
      (*local_168)(&local_178,&local_178,3);
    }
    if (local_148 != (code *)0x0) {
      (*local_148)(&local_158,&local_158,3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- non-recursive, all, from fx1 ---",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    local_198 = 0;
    uStack_190 = 0;
    local_180 = std::
                _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
                ::_M_invoke;
    local_188 = std::
                _Function_handler<void_(QPDFObjectHandle_&,_QPDFObjectHandle_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc:2438:17)>
                ::_M_manager;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_1a8 = (code *)0x0;
    uStack_1a0 = 0;
    QPDFPageObjectHelper::forEachXObject(&local_1f0,0);
    if (local_1a8 != (code *)0x0) {
      (*local_1a8)(&local_1b8,&local_1b8,3);
    }
    if (local_188 != (code *)0x0) {
      (*local_188)(&local_198,&local_198,3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- get images, page ---",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    QPDFPageObjectHelper::getImages_abi_cxx11_();
    p_Var2 = &local_2b8._M_impl.super__Rb_tree_header;
    for (p_Var4 = local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var2;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> ",4);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_2d8,local_2d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8[0] + 1);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree(&local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- get images, fx ---",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    QPDFPageObjectHelper::getImages_abi_cxx11_();
    for (p_Var4 = local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var2;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> ",4);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_2d8,local_2d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8[0] + 1);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree(&local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- get form XObjects, page ---",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    QPDFPageObjectHelper::getFormXObjects_abi_cxx11_();
    for (p_Var4 = local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var2;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> ",4);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_2d8,local_2d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8[0] + 1);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree(&local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"--- get form XObjects, fx ---",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    QPDFPageObjectHelper::getFormXObjects_abi_cxx11_();
    for (p_Var4 = local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var2;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -> ",4);
      QPDFObjectHandle::unparse_abi_cxx11_();
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_2d8,local_2d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8,local_2c8[0] + 1);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
    ::~_Rb_tree(&local_2b8);
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_1f0);
    QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_288);
    return;
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  __clang_call_terminate(uVar5);
}

Assistant:

static void
test_71(QPDF& pdf, char const* arg2)
{
    auto show = [](QPDFObjectHandle& obj, QPDFObjectHandle& xobj_dict, std::string const& key) {
        std::cout << xobj_dict.unparse() << " -> " << key << " -> " << obj.unparse() << std::endl;
    };
    auto page = QPDFPageDocumentHelper(pdf).getAllPages().at(0);
    std::cout << "--- recursive, all ---" << std::endl;
    page.forEachXObject(true, show);
    std::cout << "--- non-recursive, all ---" << std::endl;
    page.forEachXObject(false, show);
    std::cout << "--- recursive, images ---" << std::endl;
    page.forEachImage(true, show);
    std::cout << "--- non-recursive, images ---" << std::endl;
    page.forEachImage(false, show);
    std::cout << "--- recursive, form XObjects ---" << std::endl;
    page.forEachFormXObject(true, show);
    std::cout << "--- non-recursive, form XObjects ---" << std::endl;
    page.forEachFormXObject(false, show);
    auto fx1 = QPDFPageObjectHelper(
        page.getObjectHandle().getKey("/Resources").getKey("/XObject").getKey("/Fx1"));
    std::cout << "--- recursive, all, from fx1 ---" << std::endl;
    fx1.forEachXObject(true, show);
    std::cout << "--- non-recursive, all, from fx1 ---" << std::endl;
    fx1.forEachXObject(false, show);
    std::cout << "--- get images, page ---" << std::endl;
    for (auto& i: page.getImages()) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
    std::cout << "--- get images, fx ---" << std::endl;
    for (auto& i: fx1.getImages()) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
    std::cout << "--- get form XObjects, page ---" << std::endl;
    for (auto& i: page.getFormXObjects()) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
    std::cout << "--- get form XObjects, fx ---" << std::endl;
    for (auto& i: fx1.getFormXObjects()) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
}